

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::PrintCompilerAdvice
          (cmGlobalGenerator *this,ostream *os,string *lang,char *envVar)

{
  ostream *poVar1;
  char *envVar_local;
  string *lang_local;
  ostream *os_local;
  cmGlobalGenerator *this_local;
  
  std::operator<<(os,"Tell CMake where to find the compiler by setting ");
  if (envVar != (char *)0x0) {
    poVar1 = std::operator<<(os,"either the environment variable \"");
    poVar1 = std::operator<<(poVar1,envVar);
    std::operator<<(poVar1,"\" or ");
  }
  poVar1 = std::operator<<(os,"the CMake cache entry CMAKE_");
  poVar1 = std::operator<<(poVar1,(string *)lang);
  std::operator<<(poVar1,
                  "_COMPILER to the full path to the compiler, or to the compiler name if it is in the PATH."
                 );
  return;
}

Assistant:

void cmGlobalGenerator::PrintCompilerAdvice(std::ostream& os,
                                            std::string const& lang,
                                            const char* envVar) const
{
  // Subclasses override this method if they do not support this advice.
  os << "Tell CMake where to find the compiler by setting ";
  if (envVar) {
    os << "either the environment variable \"" << envVar << "\" or ";
  }
  os << "the CMake cache entry CMAKE_" << lang
     << "_COMPILER "
        "to the full path to the compiler, or to the compiler name "
        "if it is in the PATH.";
}